

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupportTest.cpp
# Opt level: O3

Utest * __thiscall
TEST_MockSupportTestWithFixture_shouldCrashOnFailure_TestShell::createTest
          (TEST_MockSupportTestWithFixture_shouldCrashOnFailure_TestShell *this)

{
  TEST_MockSupportTestWithFixture_shouldCrashOnFailure_Test *this_00;
  
  this_00 = (TEST_MockSupportTestWithFixture_shouldCrashOnFailure_Test *)
            operator_new(0x38,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupportTest.cpp"
                         ,0xe8);
  TEST_MockSupportTestWithFixture_shouldCrashOnFailure_Test::
  TEST_MockSupportTestWithFixture_shouldCrashOnFailure_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MockSupportTestWithFixture, shouldCrashOnFailure)
{
    cpputestHasCrashed = false;
    mock().crashOnFailure(true);
    UtestShell::setCrashMethod(crashMethod);
    fixture.setTestFunction(unexpectedCallTestFunction_);

    fixture.runAllTests();

    CHECK(cpputestHasCrashed);

    mock().crashOnFailure(false);
    UtestShell::resetCrashMethod();
}